

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void PairSearchHelper(ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
                     ON_RTreePairSearchCallbackResult *a_result)

{
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON__INT_PTR *pOVar4;
  
  iVar1 = a_nodeB->m_count;
  if (0 < (long)iVar1) {
    paVar3 = &a_nodeB->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar3 + -6),a_result->m_tolerance);
      if (bVar2) {
        if (a_nodeB->m_level < 1) {
          (*a_result->m_resultCallback)
                    (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                     (ON__INT_PTR)paVar3->m_child);
        }
        else {
          PairSearchHelper(a_branchA,paVar3->m_child,a_result);
        }
      }
      pOVar4 = (ON__INT_PTR *)(paVar3 + 1);
      paVar3 = paVar3 + 7;
    } while (pOVar4 < a_nodeB->m_branch + iVar1);
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;
  while(branchB < branchBmax)
  {
    if ( PairSearchOverlapHelper( &a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeB->m_level > 0 )
      {
        PairSearchHelper(a_branchA,branchB->m_child,a_result);
      }
      else
      {
        a_result->m_resultCallback(a_result->m_context,a_branchA->m_id,branchB->m_id);
      }
    }
    branchB++;
  }
}